

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional2::deinitObjects
          (PipelineStatisticsQueryTestFunctional2 *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_id);
    this->m_bo_id = 0;
  }
  if (this->m_fbo_draw_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_draw_id);
    this->m_fbo_draw_id = 0;
  }
  if (this->m_fbo_read_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_read_id);
    this->m_fbo_read_id = 0;
  }
  if (this->m_to_draw_fbo_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_draw_fbo_id);
    this->m_to_draw_fbo_id = 0;
  }
  if (this->m_to_read_fbo_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_read_fbo_id);
    this->m_to_read_fbo_id = 0;
  }
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional2::deinitObjects()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_fbo_draw_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_draw_id);

		m_fbo_draw_id = 0;
	}

	if (m_fbo_read_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_read_id);

		m_fbo_read_id = 0;
	}

	if (m_to_draw_fbo_id != 0)
	{
		gl.deleteTextures(1, &m_to_draw_fbo_id);

		m_to_draw_fbo_id = 0;
	}

	if (m_to_read_fbo_id != 0)
	{
		gl.deleteTextures(1, &m_to_read_fbo_id);

		m_to_read_fbo_id = 0;
	}
}